

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubtreeWrapper.cpp
# Opt level: O1

unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> __thiscall
IRT::CAndConditionalWrapper::ToConditional
          (CAndConditionalWrapper *this,CLabel *labelTrue,CLabel *labelFalse)

{
  long *plVar1;
  pointer pcVar2;
  CSeqStatement *this_00;
  CSeqStatement *this_01;
  CLabelStatement *this_02;
  long *in_RCX;
  pointer *__ptr;
  CLabel labelMiddle;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_128;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_120;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_118;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_110;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_108;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_100;
  CSeqStatement *local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  CLabel local_d0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  CLabel local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  CLabel::CLabel(&local_70);
  local_f8 = (CSeqStatement *)operator_new(0x18);
  plVar1 = (long *)(labelTrue->label)._M_string_length;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,local_70.label._M_dataplus._M_p,
             local_70.label._M_dataplus._M_p + local_70.label._M_string_length);
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)local_b0,*in_RCX,in_RCX[1] + *in_RCX);
  (**(code **)(*plVar1 + 0x10))(&local_120,plVar1,local_90,local_b0);
  local_110._M_head_impl = local_120._M_head_impl;
  local_120._M_head_impl = (CStatement *)0x0;
  this_01 = (CSeqStatement *)operator_new(0x18);
  this_02 = (CLabelStatement *)operator_new(0x28);
  local_d0.label._M_dataplus._M_p = (pointer)&local_d0.label.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_70.label._M_dataplus._M_p,
             local_70.label._M_dataplus._M_p + local_70.label._M_string_length);
  CLabelStatement::CLabelStatement(this_02,&local_d0);
  plVar1 = *(long **)&(labelTrue->label).field_2;
  local_f0[0] = local_e0;
  pcVar2 = (labelFalse->label)._M_dataplus._M_p;
  local_118._M_head_impl = (CStatement *)this_02;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,pcVar2,pcVar2 + (labelFalse->label)._M_string_length);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)local_50,*in_RCX,in_RCX[1] + *in_RCX);
  this_00 = local_f8;
  (**(code **)(*plVar1 + 0x10))(&local_128,plVar1,local_f0,local_50);
  local_108._M_head_impl = local_128._M_head_impl;
  local_128._M_head_impl = (CStatement *)0x0;
  CSeqStatement::CSeqStatement
            (this_01,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                      *)&local_118,
             (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
             &local_108);
  local_100._M_head_impl = (CStatement *)this_01;
  CSeqStatement::CSeqStatement
            (this_00,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                      *)&local_110,
             (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
             &local_100);
  (this->super_CConditionalWrapper).super_ISubtreeWrapper._vptr_ISubtreeWrapper =
       (_func_int **)this_00;
  if ((CSeqStatement *)local_100._M_head_impl != (CSeqStatement *)0x0) {
    (*((INode *)&((local_100._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
      [2])();
  }
  local_100._M_head_impl = (CStatement *)0x0;
  if (local_108._M_head_impl != (CStatement *)0x0) {
    (*((local_108._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
  }
  local_108._M_head_impl = (CStatement *)0x0;
  if (local_128._M_head_impl != (CStatement *)0x0) {
    (*((local_128._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
  }
  local_128._M_head_impl = (CStatement *)0x0;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0]);
  }
  if ((CLabelStatement *)local_118._M_head_impl != (CLabelStatement *)0x0) {
    (*((INode *)&((local_118._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
      [2])();
  }
  local_118._M_head_impl = (CStatement *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.label._M_dataplus._M_p != &local_d0.label.field_2) {
    operator_delete(local_d0.label._M_dataplus._M_p);
  }
  if (local_110._M_head_impl != (CStatement *)0x0) {
    (*((local_110._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
  }
  local_110._M_head_impl = (CStatement *)0x0;
  if (local_120._M_head_impl != (CStatement *)0x0) {
    (*((local_120._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
  }
  local_120._M_head_impl = (CStatement *)0x0;
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.label._M_dataplus._M_p != &local_70.label.field_2) {
    operator_delete(local_70.label._M_dataplus._M_p);
  }
  return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CStatement> CAndConditionalWrapper::ToConditional( CLabel labelTrue, CLabel labelFalse ) {
        CLabel labelMiddle;
        return std::move( std::unique_ptr<const CStatement>(
                new CSeqStatement(
                        std::move( operandLeft->ToConditional( labelMiddle, labelFalse )),
                        std::move( std::unique_ptr<const CStatement>(
                                new CSeqStatement(
                                        std::move( std::unique_ptr<const CStatement>(
                                                new CLabelStatement( labelMiddle ))),
                                        std::move( operandRight->ToConditional( labelTrue, labelFalse ))
                                )
                        ))
                )
        ));
    }